

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,UnaryExpression *unary_exp,void *data)

{
  pointer pSVar1;
  undefined8 uVar2;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  TokenDetail *in_stack_00000010;
  char *in_stack_00000018;
  SemanticException *in_stack_00000020;
  ExpVarData *parent_exp_var_data;
  ExpVarData exp_var_data;
  ExpVarData local_24;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ExpVarData::ExpVarData(&local_24,SemanticOp_Read);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x192dda);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_24);
  if (local_24.exp_type_ != ExpType_Unknown) {
    if (*(int *)(local_10 + 0x28) == 0x23) {
      if ((local_24.exp_type_ != ExpType_Table) && (local_24.exp_type_ != ExpType_String)) {
        uVar2 = __cxa_allocate_exception(0x20);
        SemanticException::SemanticException(in_stack_00000020,in_stack_00000018,in_stack_00000010);
        __cxa_throw(uVar2,&SemanticException::typeinfo,SemanticException::~SemanticException);
      }
    }
    else if ((*(int *)(local_10 + 0x28) == 0x2d) && (local_24.exp_type_ != ExpType_Number)) {
      uVar2 = __cxa_allocate_exception(0x20);
      SemanticException::SemanticException(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      __cxa_throw(uVar2,&SemanticException::typeinfo,SemanticException::~SemanticException);
    }
  }
  if ((*(int *)(local_10 + 0x28) == 0x2d) || (*(int *)(local_10 + 0x28) == 0x23)) {
    *(undefined4 *)(local_18 + 4) = 3;
  }
  else {
    if (*(int *)(local_10 + 0x28) != 0x10d) {
      __assert_fail("!\"unexpect unary operator\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                    ,0x247,
                    "virtual void luna::SemanticAnalysisVisitor::Visit(UnaryExpression *, void *)");
    }
    *(undefined4 *)(local_18 + 4) = 2;
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(UnaryExpression *unary_exp, void *data)
    {
        // Unary expression is read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        unary_exp->exp_->Accept(this, &exp_var_data);

        // Expression type
        if (exp_var_data.exp_type_ != ExpType_Unknown)
        {
            switch (unary_exp->op_token_.token_)
            {
                case '-':
                    if (exp_var_data.exp_type_ != ExpType_Number)
                        throw SemanticException("operand is not number",
                                                unary_exp->op_token_);
                    break;
                case '#':
                    if (exp_var_data.exp_type_ != ExpType_Table &&
                        exp_var_data.exp_type_ != ExpType_String)
                        throw SemanticException("operand is not table or string",
                                                unary_exp->op_token_);
                    break;
                default:
                    break;
            }
        }

        auto parent_exp_var_data = static_cast<ExpVarData *>(data);
        if (unary_exp->op_token_.token_ == '-' ||
            unary_exp->op_token_.token_ == '#')
            parent_exp_var_data->exp_type_ = ExpType_Number;
        else if (unary_exp->op_token_.token_ == Token_Not)
            parent_exp_var_data->exp_type_ = ExpType_Bool;
        else
            assert(!"unexpect unary operator");
    }